

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::SortDescending
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this,
          vector<double,_std::allocator<double>_> *values)

{
  pointer pdVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  vector<double,_std::allocator<double>_> valuesDescending;
  allocator_type local_29;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  SortAscending(this,values);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_28,
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_29);
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  for (uVar3 = 0; uVar4 = (ulong)uVar3, lVar2 >> 3 != uVar4; uVar3 = uVar3 + 1) {
    *(double *)((long)local_28._M_impl.super__Vector_impl_data._M_start + ~uVar4 * 8 + lVar2) =
         pdVar1[uVar4];
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (values,(vector<double,_std::allocator<double>_> *)&local_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void SortDescending(std::vector<double> &values) const{
    SortAscending(values);
    
    // invert the sorting
    std::vector<double> valuesDescending(values.size());
    for(Index i=0;i!=values.size();++i)
        valuesDescending[values.size()-1-i]=values[i];
    values=valuesDescending;
}